

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

uint32_t container_rank_many(container_t *c,uint8_t type,uint64_t start_rank,uint32_t *begin,
                            uint32_t *end,uint64_t *ans)

{
  uint32_t uVar1;
  run_container_t *container;
  uint64_t *in_RCX;
  uint32_t *in_RDX;
  uint8_t in_SIL;
  container_t *in_RDI;
  uint32_t *in_R8;
  uint64_t *in_R9;
  uint32_t *unaff_retaddr;
  uint32_t *in_stack_00000008;
  undefined7 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  container = (run_container_t *)container_unwrap_shared(in_RDI,&stack0xffffffffffffffef);
  if (in_SIL == '\x01') {
    uVar1 = bitset_container_rank_many
                      ((bitset_container_t *)end,(uint64_t)ans,in_stack_00000008,unaff_retaddr,
                       (uint64_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else if (in_SIL == '\x02') {
    uVar1 = array_container_rank_many
                      ((array_container_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (uint64_t)container,(uint32_t *)CONCAT17(2,in_stack_ffffffffffffffe8),in_RDX,
                       in_RCX);
  }
  else {
    uVar1 = run_container_rank_many(container,(uint64_t)in_RDX,(uint32_t *)in_RCX,in_R8,in_R9);
  }
  return uVar1;
}

Assistant:

static inline uint32_t container_rank_many(const container_t *c, uint8_t type,
                                           uint64_t start_rank,
                                           const uint32_t *begin,
                                           const uint32_t *end, uint64_t *ans) {
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_rank_many(const_CAST_bitset(c), start_rank,
                                              begin, end, ans);
        case ARRAY_CONTAINER_TYPE:
            return array_container_rank_many(const_CAST_array(c), start_rank,
                                             begin, end, ans);
        case RUN_CONTAINER_TYPE:
            return run_container_rank_many(const_CAST_run(c), start_rank, begin,
                                           end, ans);
        default:
            assert(false);
            roaring_unreachable;
    }
    assert(false);
    roaring_unreachable;
    return 0;
}